

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

Iterator<int,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
          (Iterator<int,_true,_std::allocator<unsigned_long>_> *this,difference_type *x)

{
  view_pointer this_00;
  size_t index;
  bool bVar1;
  reference piVar2;
  iterator outit;
  difference_type *x_local;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *this_local;
  
  marray_detail::Assert<bool>(this->view_ != (view_pointer)0x0);
  marray_detail::Assert<bool>(*x <= (long)this->index_);
  this->index_ = this->index_ - *x;
  bVar1 = View<int,_true,_std::allocator<unsigned_long>_>::isSimple(this->view_);
  if (bVar1) {
    this->pointer_ = this->pointer_ + -*x;
  }
  else {
    piVar2 = View<int,_true,_std::allocator<unsigned_long>_>::operator()(this->view_,this->index_);
    this->pointer_ = piVar2;
    this_00 = this->view_;
    index = this->index_;
    outit = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->coordinates_);
    View<int,true,std::allocator<unsigned_long>>::
    indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<int,true,std::allocator<unsigned_long>> *)this_00,index,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )outit._M_current);
  }
  testInvariant(this);
  return this;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator-=
(
    const difference_type& x
)
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || static_cast<difference_type>(index_) >= x);
    index_ -= x;
    if(view_->isSimple()) {
        pointer_ -= x;
    }
    else {
        pointer_ = &((*view_)(index_));
        view_->indexToCoordinates(index_, coordinates_.begin());
    }
    testInvariant();
    return *this;
}